

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void first_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  void *pvVar1;
  sqlite3_value *psVar2;
  NthValueCtx *p;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  pvVar1 = sqlite3_aggregate_context(pCtx,0x10);
  if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 8) == 0)) {
    psVar2 = sqlite3_value_dup(*apArg);
    *(sqlite3_value **)((long)pvVar1 + 8) = psVar2;
    if (*(long *)((long)pvVar1 + 8) == 0) {
      sqlite3_result_error_nomem(pCtx);
    }
  }
  return;
}

Assistant:

static void first_valueStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pValue==0 ){
    p->pValue = sqlite3_value_dup(apArg[0]);
    if( !p->pValue ){
      sqlite3_result_error_nomem(pCtx);
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
}